

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.cxx
# Opt level: O0

cmList * __thiscall
cmList::transform(cmList *this,TransformAction action,
                 unique_ptr<cmList::TransformSelector,_std::default_delete<cmList::TransformSelector>_>
                 *selector)

{
  pointer pAVar1;
  pointer this_00;
  TransformSelector *selector_00;
  type pTVar2;
  anon_class_8_1_70dd1d2d local_50;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_48;
  _Rb_tree_const_iterator<(anonymous_namespace)::ActionDescriptor> local_28;
  iterator descriptor;
  unique_ptr<cmList::TransformSelector,_std::default_delete<cmList::TransformSelector>_>
  *selector_local;
  TransformAction action_local;
  cmList *this_local;
  
  descriptor._M_node = (_Base_ptr)selector;
  local_28._M_node = (_Base_ptr)anon_unknown.dwarf_399f32::TransformConfigure(action,selector,0);
  pAVar1 = std::_Rb_tree_const_iterator<(anonymous_namespace)::ActionDescriptor>::operator->
                     (&local_28);
  this_00 = std::
            unique_ptr<(anonymous_namespace)::TransformAction,_std::default_delete<(anonymous_namespace)::TransformAction>_>
            ::operator->(&pAVar1->Transform);
  selector_00 = (TransformSelector *)
                std::
                unique_ptr<cmList::TransformSelector,_std::default_delete<cmList::TransformSelector>_>
                ::get(selector);
  anon_unknown.dwarf_399f32::TransformAction::Initialize(this_00,selector_00);
  pTVar2 = std::
           unique_ptr<cmList::TransformSelector,_std::default_delete<cmList::TransformSelector>_>::
           operator*(selector);
  local_50.descriptor = &local_28;
  std::function<std::__cxx11::string(std::__cxx11::string_const&)>::
  function<cmList::transform(cmList::TransformAction,std::unique_ptr<cmList::TransformSelector,std::default_delete<cmList::TransformSelector>>)::__0,void>
            ((function<std::__cxx11::string(std::__cxx11::string_const&)> *)&local_48,&local_50);
  (*pTVar2->_vptr_TransformSelector[5])(pTVar2,this,&local_48);
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_48);
  return this;
}

Assistant:

cmList& cmList::transform(TransformAction action,
                          std::unique_ptr<TransformSelector> selector)
{
  auto descriptor = TransformConfigure(action, selector, 0);

  descriptor->Transform->Initialize(
    static_cast<::TransformSelector*>(selector.get()));

  static_cast<::TransformSelector&>(*selector).Transform(
    this->Values, [&descriptor](const std::string& s) -> std::string {
      return (*descriptor->Transform)(s);
    });

  return *this;
}